

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Storage.hpp
# Opt level: O1

void __thiscall
MOS::MOS6522::MOS6522<Apple::II::Mockingboard::AYVIA>::shift_out
          (MOS6522<Apple::II::Mockingboard::AYVIA> *this)

{
  byte bVar1;
  bool bVar2;
  AYVIA *pAVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  
  bVar5 = (this->super_MOS6522Storage).registers_.auxiliary_control & 0x1c;
  iVar4 = (this->super_MOS6522Storage).shift_bits_remaining_;
  if (bVar5 == 0x10 || iVar4 != 0) {
    bVar1 = (this->super_MOS6522Storage).registers_.shift;
    bVar6 = bVar1 >> 7;
    if (bVar5 != 0x10) {
      bVar6 = 0;
    }
    (this->super_MOS6522Storage).registers_.shift = bVar6 | bVar1 * '\x02';
    iVar4 = iVar4 + -1;
    (this->super_MOS6522Storage).shift_bits_remaining_ = iVar4;
    if (iVar4 == 0) {
      bVar2 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
      bVar5 = (this->super_MOS6522Storage).registers_.interrupt_flags | 4;
      (this->super_MOS6522Storage).registers_.interrupt_flags = bVar5;
      bVar7 = (bVar5 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7f) != 0;
      if (bVar2 != bVar7) {
        (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar7;
        (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
        pAVar3 = this->bus_handler_;
        pAVar3->interrupt = bVar7;
        (*((pAVar3->card->super_Card).delegate_)->_vptr_Delegate[1])();
        return;
      }
    }
  }
  return;
}

Assistant:

ShiftMode shift_mode() const {
			return ShiftMode((registers_.auxiliary_control >> 2) & 7);
		}